

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

double exp(double __x)

{
  float fVar1;
  vector<Blade,_std::allocator<Blade>_> *in_RSI;
  vector<Blade,_std::allocator<Blade>_> *in_RDI;
  float tv;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Clifford tP;
  Clifford local_108;
  vector<Blade,_std::allocator<Blade>_> local_f0;
  vector<Blade,_std::allocator<Blade>_> local_d8;
  vector<Blade,_std::allocator<Blade>_> local_c0;
  vector<Blade,_std::allocator<Blade>_> local_a8;
  vector<Blade,_std::allocator<Blade>_> local_90;
  vector<Blade,_std::allocator<Blade>_> local_78;
  vector<Blade,_std::allocator<Blade>_> local_60;
  Clifford local_48;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_f0,in_RSI);
  (in_RDI->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Blade::Blade((Blade *)&local_108,0,1.0);
  std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>(in_RDI,(Blade *)&local_108);
  Blade::~Blade((Blade *)&local_108);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_a8,in_RDI);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c0,in_RSI);
  operator+(&local_108,&local_a8,&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(in_RDI,&local_108);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_108);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
  fVar1 = 2.0;
  while (tv = fVar1, tv <= 6.0) {
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_d8,in_RSI);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_60,&local_f0);
    operator*(&local_48,&local_d8,&local_60);
    operator/(&local_108,&local_48,tv);
    std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(&local_f0,&local_108);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_108);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
    fVar1 = 7.0;
    if (local_f0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_f0.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      std::vector<Blade,_std::allocator<Blade>_>::vector(&local_90,in_RDI);
      std::vector<Blade,_std::allocator<Blade>_>::vector(&local_78,&local_f0);
      operator+(&local_108,&local_90,&local_78);
      std::vector<Blade,_std::allocator<Blade>_>::_M_move_assign(in_RDI,&local_108);
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_108);
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
      std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
      fVar1 = tv + 1.0;
    }
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_f0);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

Clifford exp(Clifford& P)
{
  Clifford tP=P,R;
  R.push_back(Blade(0,1.0));
  R=R+P;  
  for(float n=2;n<=6;n++)
  {	
	tP = P * tP/n;
	if(tP.size())R=R+tP;
	else{n=6;}
  }
  return R;
}